

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O3

void __thiscall
QVLABase<QMutableTouchEvent>::reallocate_impl
          (QVLABase<QMutableTouchEvent> *this,qsizetype prealloc,void *array,qsizetype asize,
          qsizetype aalloc)

{
  QMutableTouchEvent *first;
  long lVar1;
  undefined1 auVar2 [16];
  size_t __size;
  ulong uVar3;
  QMutableTouchEvent *pQVar4;
  qsizetype n;
  long lVar5;
  
  first = (QMutableTouchEvent *)(this->super_QVLABaseBase).ptr;
  lVar1 = (this->super_QVLABaseBase).a;
  lVar5 = (this->super_QVLABaseBase).s;
  n = asize;
  if (lVar5 < asize) {
    n = lVar5;
  }
  pQVar4 = first;
  if (lVar1 != aalloc) {
    pQVar4 = (QMutableTouchEvent *)array;
    if (prealloc < aalloc) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = aalloc;
      __size = SUB168(auVar2 * ZEXT816(0x50),0);
      if (SUB168(auVar2 * ZEXT816(0x50),8) == 0) {
        uVar3 = QtPrivate::expectedAllocSize(__size,0x10);
        if (uVar3 != 0) {
          aalloc = uVar3 / 0x50;
          __size = aalloc * 0x50;
        }
        prealloc = aalloc;
        if (__size == 0) {
          pQVar4 = (QMutableTouchEvent *)0x0;
        }
        else {
          pQVar4 = (QMutableTouchEvent *)malloc(__size);
        }
      }
      else {
        pQVar4 = (QMutableTouchEvent *)0x0;
        prealloc = aalloc;
      }
    }
    QtPrivate::q_uninitialized_relocate_n<QMutableTouchEvent,long_long>(first,n,pQVar4);
    (this->super_QVLABaseBase).ptr = pQVar4;
    (this->super_QVLABaseBase).a = prealloc;
  }
  (this->super_QVLABaseBase).s = n;
  if (asize < lVar5) {
    pQVar4 = first + asize;
    lVar5 = lVar5 * 0x50 + asize * -0x50;
    do {
      (*(code *)**(undefined8 **)&(pQVar4->super_QTouchEvent).super_QPointerEvent.super_QInputEvent)
                (pQVar4);
      pQVar4 = pQVar4 + 1;
      lVar5 = lVar5 + -0x50;
    } while (lVar5 != 0);
    pQVar4 = (QMutableTouchEvent *)(this->super_QVLABaseBase).ptr;
  }
  if ((first != (QMutableTouchEvent *)array) && (first != pQVar4)) {
    QtPrivate::sizedFree(first,lVar1 * 0x50);
    return;
  }
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QVLABase<T>::reallocate_impl(qsizetype prealloc, void *array, qsizetype asize, qsizetype aalloc)
{
    Q_ASSERT(aalloc >= asize);
    Q_ASSERT(data());
    T *oldPtr = data();
    qsizetype osize = size();
    const qsizetype oalloc = capacity();

    const qsizetype copySize = qMin(asize, osize);
    Q_ASSERT(copySize >= 0);

    if (aalloc != oalloc) {
        QVLABaseBase::malloced_ptr guard;
        void *newPtr;
        qsizetype newA;
        if (aalloc > prealloc) {
            newPtr = QtPrivate::fittedMalloc(0, &aalloc, sizeof(T));
            guard.reset(newPtr);
            Q_CHECK_PTR(newPtr); // could throw
            // by design: in case of QT_NO_EXCEPTIONS malloc must not fail or it crashes here
            newA = aalloc;
        } else {
            newPtr = array;
            newA = prealloc;
        }
        QtPrivate::q_uninitialized_relocate_n(oldPtr, copySize,
                                              reinterpret_cast<T *>(newPtr));
        // commit:
        ptr = newPtr;
        guard.release();
        a = newA;
    }
    s = copySize;

    // destroy remaining old objects
    if constexpr (QTypeInfo<T>::isComplex) {
        if (osize > asize)
            std::destroy(oldPtr + asize, oldPtr + osize);
    }

    if (oldPtr != reinterpret_cast<T *>(array) && oldPtr != data())
        QtPrivate::sizedFree(oldPtr, oalloc, sizeof(T));
}